

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_parse_result * __thiscall
pugi::xml_document::load_file
          (xml_parse_result *__return_storage_ptr__,xml_document *this,char *path_,uint options,
          xml_encoding encoding)

{
  FILE *__stream;
  
  _destroy(this);
  _create(this);
  __stream = fopen(path_,"rb");
  impl::anon_unknown_0::load_file_impl
            (__return_storage_ptr__,(xml_document_struct *)(this->super_xml_node)._root,
             (FILE *)__stream,options,encoding,&this->_buffer);
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return __return_storage_ptr__;
}

Assistant:

PUGI_IMPL_FN xml_parse_result xml_document::load_file(const char* path_, unsigned int options, xml_encoding encoding)
	{
		reset();

		using impl::auto_deleter; // MSVC7 workaround
		auto_deleter<FILE> file(impl::open_file(path_, "rb"), impl::close_file);

		return impl::load_file_impl(static_cast<impl::xml_document_struct*>(_root), file.data, options, encoding, &_buffer);
	}